

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectTopXors(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *vPart [2];
  Gia_Obj_t *local_58 [2];
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  
  pVVar7 = p->vCos;
  iVar3 = pVVar7->nSize;
  if (iVar3 < 1) {
LAB_001f44f9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = *pVVar7->pArray;
  if (((long)iVar8 < 0) || (uVar4 = p->nObjs, (int)uVar4 <= iVar8)) {
LAB_001f44da:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar12 = p->pObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  if (iVar3 == 1) {
    uVar9 = (uint)*(undefined8 *)(pGVar12 + iVar8);
    pGVar2 = pGVar12 + iVar8 + -(ulong)(uVar9 & 0x1fffffff);
    if ((uVar9 >> 0x1d & 1) == 0) {
      if ((pGVar2 < pGVar12) || (pGVar12 + uVar4 <= pGVar2)) {
LAB_001f44bb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pVVar5,(int)((ulong)((long)pGVar2 - (long)pGVar12) >> 2) * -0x55555555);
    }
    else {
      Gia_ManCollectTopXors_rec(p,pGVar2,pVVar5);
    }
  }
  else {
    lVar10 = 0;
    do {
      iVar3 = pVVar7->pArray[lVar10];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001f44da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(uint *)(p->pObjs + iVar3) & 0x1fffffff;
      iVar8 = iVar3 - uVar4;
      if (iVar8 != 0 && (int)uVar4 <= iVar3) {
        Vec_IntPush(pVVar5,iVar8);
        pVVar7 = p->vCos;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  Gia_ManDupDemiterOrderXors(p,pVVar5);
  iVar3 = pVVar5->nSize;
  if (1 < iVar3) {
    piVar6 = pVVar5->pArray;
    iVar8 = -1;
    lVar10 = 0;
    do {
      iVar1 = piVar6[lVar10];
      piVar6[lVar10] = piVar6[iVar3 + iVar8];
      piVar6[pVVar5->nSize + iVar8] = iVar1;
      lVar10 = lVar10 + 1;
      iVar3 = pVVar5->nSize;
      iVar8 = iVar8 + -1;
    } while (lVar10 < iVar3 / 2);
  }
  Gia_ManCleanMark01(p);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  local_48 = pVVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  local_40 = p_00;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      iVar3 = pVVar5->pArray[lVar10];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001f44da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = p->pObjs + iVar3;
      iVar3 = Gia_ObjRecognizeExor(pGVar12,local_58,local_58 + 1);
      if (iVar3 == 0) {
        local_58[1] = p->pObjs;
      }
      else {
        pGVar12 = (Gia_Obj_t *)((ulong)local_58[0] & 0xfffffffffffffffe);
        local_58[1] = (Gia_Obj_t *)((ulong)local_58[1] & 0xfffffffffffffffe);
      }
      local_58[0] = pGVar12;
      uVar4 = Gia_ManDecideWhereToAdd(p,&local_48,local_58);
      pGVar12 = local_58[uVar4];
      pGVar2 = p->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) goto LAB_001f44bb;
      Vec_IntPush(pVVar7,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar12 = local_58[uVar4 ^ 1];
      pGVar2 = p->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) goto LAB_001f44bb;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar12 = local_58[uVar4];
      pGVar2 = p->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) goto LAB_001f44bb;
      Gia_ManSetMark0Dfs_rec(p,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar12 = local_58[uVar4 ^ 1];
      pGVar2 = p->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) goto LAB_001f44bb;
      Gia_ManSetMark1Dfs_rec(p,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  Gia_ManCleanMark01(p);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      if (p_00->nSize <= lVar10) goto LAB_001f44f9;
      iVar3 = p_00->pArray[lVar10];
      Vec_IntPush(pVVar5,pVVar7->pArray[lVar10]);
      Vec_IntPush(pVVar5,iVar3);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  uVar4 = pVVar5->nSize;
  if (1 < (int)uVar4) {
    piVar6 = pVVar5->pArray;
    uVar9 = uVar4 >> 1;
    uVar11 = 0;
    do {
      uVar4 = uVar4 - 1;
      iVar3 = piVar6[uVar11];
      piVar6[uVar11] = piVar6[(int)uVar4];
      piVar6[(int)uVar4] = iVar3;
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManCollectTopXors( Gia_Man_t * p )
{
    int i, iObj, iObj2, fFlip, Count1 = 0;
    Vec_Int_t * vXors, * vPart[2], * vOrder; 
    Gia_Obj_t * pFan[2], * pObj = Gia_ManCo(p, 0);
    vXors = Vec_IntAlloc( 100 );
    if ( Gia_ManCoNum(p) == 1 )
    {
        if ( Gia_ObjFaninC0(pObj) )
            Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
        else
            Vec_IntPush( vXors, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjFaninId0p(p, pObj) > 0 )
                Vec_IntPush( vXors, Gia_ObjFaninId0p(p, pObj) );
    }
    // order by support size
    Gia_ManDupDemiterOrderXors( p, vXors );
    //Vec_IntPrint( vXors );
    Vec_IntReverseOrder( vXors ); // from MSB to LSB
    // divide into groups
    Gia_ManCleanMark01(p);
    vPart[0] = Vec_IntAlloc( 100 );
    vPart[1] = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vXors, p, pObj, i )
    {
        int fCompl = 0;
        if ( !Gia_ObjRecognizeExor(pObj, &pFan[0], &pFan[1]) )
            pFan[0] = pObj, pFan[1] = Gia_ManConst0(p), Count1++;
        else
        {
            fCompl ^= Gia_IsComplement(pFan[0]);
            fCompl ^= Gia_IsComplement(pFan[1]);
            pFan[0] = Gia_Regular(pFan[0]);
            pFan[1] = Gia_Regular(pFan[1]);
        }
        fFlip = Gia_ManDecideWhereToAdd( p, vPart, pFan );
        Vec_IntPush( vPart[0], Gia_ObjId(p, pFan[fFlip]) );
        Vec_IntPush( vPart[1], Gia_ObjId(p, pFan[!fFlip]) );
        Gia_ManSetMark0Dfs_rec( p, Gia_ObjId(p, pFan[fFlip]) );
        Gia_ManSetMark1Dfs_rec( p, Gia_ObjId(p, pFan[!fFlip]) );
    }
    //printf( "Detected %d single-output XOR miters and %d other miters.\n", Vec_IntSize(vXors) - Count1, Count1 );
    Vec_IntFree( vXors );
    Gia_ManCleanMark01(p);
    // create new order
    vOrder = Vec_IntAlloc( 100 );
    Vec_IntForEachEntryTwo( vPart[0], vPart[1], iObj, iObj2, i )
        Vec_IntPushTwo( vOrder, iObj, iObj2 );
    Vec_IntFree( vPart[0] );
    Vec_IntFree( vPart[1] );
    Vec_IntReverseOrder( vOrder ); // from LSB to MSB
    //Vec_IntPrint( vOrder );
    return vOrder;
}